

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O3

void update_window_title(GLFWwindow *window)

{
  char *pcVar1;
  char title [256];
  char acStack_118 [264];
  
  pcVar1 = " (swap tear)";
  if (swap_tear == '\0') {
    pcVar1 = "";
  }
  if (-1 < swap_interval) {
    pcVar1 = "";
  }
  sprintf(acStack_118,"Tearing detector (interval %i%s, %0.1f Hz)",frame_rate,
          (ulong)(uint)swap_interval,pcVar1);
  glfwSetWindowTitle(window,acStack_118);
  return;
}

Assistant:

static void update_window_title(GLFWwindow* window)
{
    char title[256];

    sprintf(title, "Tearing detector (interval %i%s, %0.1f Hz)",
            swap_interval,
            (swap_tear && swap_interval < 0) ? " (swap tear)" : "",
            frame_rate);

    glfwSetWindowTitle(window, title);
}